

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfSelectClient.cpp
# Opt level: O0

void __thiscall xmrig::SelfSelectClient::tick(SelfSelectClient *this,uint64_t now)

{
  uint64_t uVar1;
  undefined8 in_RSI;
  long in_RDI;
  SelfSelectClient *in_stack_000000d0;
  
  (**(code **)(**(long **)(in_RDI + 0x20) + 200))(*(long **)(in_RDI + 0x20),in_RSI);
  if ((*(int *)(in_RDI + 0x150) == 2) &&
     (uVar1 = Chrono::steadyMSecs(), *(ulong *)(in_RDI + 0x158) <= uVar1 - *(long *)(in_RDI + 0x160)
     )) {
    getBlockTemplate(in_stack_000000d0);
  }
  return;
}

Assistant:

void xmrig::SelfSelectClient::tick(uint64_t now)
{
    m_client->tick(now);

    if (m_state == RetryState) {
        if (Chrono::steadyMSecs() - m_timestamp < m_retryPause) {
            return;
        }

        getBlockTemplate();
    }
}